

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_lcl.c
# Opt level: O3

void beltBlockMulC(u32 *block)

{
  u32 uVar1;
  
  uVar1 = block[3];
  block[3] = uVar1 << 1 | block[2] >> 0x1f;
  block[2] = block[2] << 1 | block[1] >> 0x1f;
  block[1] = block[1] << 1 | *block >> 0x1f;
  *block = *block * 2 ^ (int)uVar1 >> 0x1f & 0x87U;
  return;
}

Assistant:

void beltBlockMulC(u32 block[4])
{
	register u32 t = ~((block[3] >> 31) - U32_1) & 0x00000087;
	block[3] = (block[3] << 1) ^ (block[2] >> 31);
	block[2] = (block[2] << 1) ^ (block[1] >> 31);
	block[1] = (block[1] << 1) ^ (block[0] >> 31);
	block[0] = (block[0] << 1) ^ t;
	t = 0;
}